

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ArrayFeatureType::ArrayFeatureType(ArrayFeatureType *this)

{
  ArrayFeatureType *pAVar1;
  ArrayFeatureType *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureType_0056a738;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->shape_);
  ShapeFlexibilityUnion::ShapeFlexibilityUnion((ShapeFlexibilityUnion *)&this->ShapeFlexibility_);
  DefaultOptionalValueUnion::DefaultOptionalValueUnion
            ((DefaultOptionalValueUnion *)&this->defaultOptionalValue_);
  pAVar1 = internal_default_instance();
  if (this != pAVar1) {
    protobuf_FeatureTypes_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

ArrayFeatureType::ArrayFeatureType()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_FeatureTypes_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ArrayFeatureType)
}